

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void satoko_sort(void **data,uint size,_func_int_void_ptr_void_ptr *comp_fn)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  uint local_38;
  uint local_34;
  int i;
  uint j;
  void *temp;
  void *pivot;
  _func_int_void_ptr_void_ptr *comp_fn_local;
  uint size_local;
  void **data_local;
  
  if (size < 0x10) {
    select_sort(data,size,comp_fn);
  }
  else {
    pvVar1 = data[size >> 1];
    local_38 = 0xffffffff;
    local_34 = size;
    while( true ) {
      do {
        local_38 = local_38 + 1;
        iVar3 = (*comp_fn)(data[(int)local_38],pvVar1);
      } while (iVar3 != 0);
      do {
        local_34 = local_34 - 1;
        iVar3 = (*comp_fn)(pvVar1,data[local_34]);
      } while (iVar3 != 0);
      if (local_34 <= local_38) break;
      pvVar2 = data[(int)local_38];
      data[(int)local_38] = data[local_34];
      data[local_34] = pvVar2;
    }
    satoko_sort(data,local_38,comp_fn);
    satoko_sort(data + (int)local_38,size - local_38,comp_fn);
  }
  return;
}

Assistant:

static void satoko_sort(void **data, unsigned size,
            int (*comp_fn)(const void *, const void *))
{
    if (size <= 15)
        select_sort(data, size, comp_fn);
    else {
        void *pivot = data[size / 2];
        void *temp;
        unsigned j = size;
        int i = -1;

        for (;;) {
            do {
                i++;
            } while (comp_fn(data[i], pivot));
            do {
                j--;
            } while (comp_fn(pivot, data[j]));

            if ((unsigned) i >= j)
                break;

            temp = data[i];
            data[i] = data[j];
            data[j] = temp;
        }
        satoko_sort(data, (unsigned) i, comp_fn);
        satoko_sort(data + i, (size - (unsigned) i), comp_fn);
    }
}